

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<upb_MessageDef_const*(*)(upb_DefPool*)>
               (_func_upb_MessageDef_ptr_upb_DefPool_ptr **value,ostream *os)

{
  ostream *os_local;
  _func_upb_MessageDef_ptr_upb_DefPool_ptr **value_local;
  
  FunctionPointerPrinter::PrintValue<upb_MessageDef_const*(upb_DefPool*),void>(*value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}